

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,StructSchema schema)

{
  StructSchema schema_00;
  StructSchema SVar1;
  StructSize size;
  undefined7 in_stack_ffffffffffffffa8;
  DebugExpression<bool> in_stack_ffffffffffffffaf;
  StructSchema schema_local;
  Fault f;
  void *local_38;
  uint local_28;
  
  schema_local = schema;
  Schema::getProto((Reader *)&f,&schema_local.super_Schema);
  SVar1 = schema_local;
  if ((0xe0 < local_28) &&
     (in_stack_ffffffffffffffaf.value = (bool)(*(byte *)((long)local_38 + 0x1c) & 1 ^ 1),
     (*(byte *)((long)local_38 + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x776,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",
               (DebugExpression<bool> *)&stack0xffffffffffffffaf,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&f);
  }
  schema_00.super_Schema.raw._7_1_ = in_stack_ffffffffffffffaf.value;
  schema_00.super_Schema.raw._0_7_ = in_stack_ffffffffffffffa8;
  size = anon_unknown_71::structSizeFromSchema(schema_00);
  PointerBuilder::getStruct(&__return_storage_ptr__->builder,&builder,size,(word *)0x0);
  (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)SVar1.super_Schema.raw;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema, builder.getStruct(
      structSizeFromSchema(schema), nullptr));
}